

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_encode(uchar **out,size_t *outsize,uchar *image,uint w,uint h,LodePNGState *state)

{
  char *pcVar1;
  undefined4 uVar2;
  char **ppcVar3;
  char **ppcVar4;
  size_t sVar5;
  uint uVar6;
  int iVar7;
  uchar *out_00;
  size_t sVar8;
  long lVar9;
  size_t sVar10;
  long lVar11;
  LodePNGEncoderSettings *pLVar12;
  ucvector outv;
  uchar *data;
  size_t datasize;
  LodePNGInfo info;
  ucvector local_178;
  LodePNGEncoderSettings *local_158;
  char **local_150;
  char **local_148;
  uchar *local_140;
  size_t local_138;
  LodePNGColorMode *local_130;
  uchar **local_128;
  size_t *local_120;
  undefined1 local_118 [32];
  size_t sStack_f8;
  uint uStack_f0;
  uint local_e0;
  undefined1 auStack_dc [12];
  undefined4 uStack_d0;
  uint uStack_cc;
  char **ppcStack_c8;
  char **ppcStack_c0;
  size_t sStack_b8;
  char **ppcStack_b0;
  char **ppcStack_a8;
  char **local_a0;
  char **local_98;
  uint local_90;
  LodePNGTime local_8c;
  uint local_74;
  uchar *local_60;
  uchar *puStack_58;
  uchar *puStack_50;
  uchar *puStack_48;
  size_t local_40;
  size_t local_38;
  
  local_140 = (uchar *)0x0;
  local_138 = 0;
  *out = (uchar *)0x0;
  *outsize = 0;
  state->error = 0;
  local_118._16_8_ = 0x800000006;
  register0x00001200 = ZEXT1632(ZEXT816(0) << 0x40);
  local_118._8_4_ = 0;
  local_118._0_4_ = 0;
  local_118._4_4_ = 0;
  local_74 = 0;
  local_60 = (uchar *)0x0;
  puStack_58 = (uchar *)0x0;
  local_40 = 0;
  local_38 = 0;
  local_e0 = 0;
  auStack_dc = SUB6412(ZEXT464(0) << 0x40,4);
  uStack_d0 = 0;
  ppcStack_c8 = SUB648(ZEXT464(0) << 0x40,4);
  ppcStack_c0 = (char **)0x0;
  sStack_b8 = 0;
  ppcStack_b0 = (char **)0x0;
  ppcStack_a8 = (char **)0x0;
  local_a0 = (char **)0x0;
  local_98 = (char **)0x0;
  local_90 = 0;
  local_120 = outsize;
  uStack_cc = local_e0;
  puStack_50 = local_60;
  puStack_48 = puStack_58;
  lodepng_info_copy((LodePNGInfo *)local_118,&state->info_png);
  if (((local_118._16_4_ == LCT_PALETTE) || ((state->encoder).force_palette != 0)) &&
     (sStack_f8 - 0x101 < 0xffffffffffffff00)) {
    state->error = 0x44;
    return 0x44;
  }
  if ((state->encoder).auto_convert == 0) {
    uVar6 = state->error;
  }
  else {
    uVar6 = lodepng_auto_choose_color
                      ((LodePNGColorMode *)(local_118 + 0x10),image,w,h,&state->info_raw);
    state->error = uVar6;
  }
  if (uVar6 != 0) {
    return uVar6;
  }
  pLVar12 = &state->encoder;
  if (2 < (pLVar12->zlibsettings).btype) {
    state->error = 0x3d;
    return 0x3d;
  }
  if (1 < (state->info_png).interlace_method) {
    state->error = 0x47;
    return 0x47;
  }
  local_150 = (char **)(local_118._16_8_ & 0xffffffff);
  uVar2 = local_118._20_4_;
  local_128 = out;
  uVar6 = checkColorValidity(local_118._16_4_,local_118._20_4_);
  state->error = uVar6;
  if (uVar6 != 0) {
    return uVar6;
  }
  local_148 = (char **)CONCAT44(local_148._4_4_,uVar2);
  uVar6 = checkColorValidity((state->info_raw).colortype,(state->info_raw).bitdepth);
  state->error = uVar6;
  if (uVar6 != 0) {
    return uVar6;
  }
  iVar7 = lodepng_color_mode_equal(&state->info_raw,(LodePNGColorMode *)(local_118 + 0x10));
  if (iVar7 == 0) {
    iVar7 = 0;
    if ((uint)local_150 < 7) {
      iVar7 = *(int *)(&DAT_00517ec4 + (long)local_150 * 4);
    }
    lVar11 = (ulong)(iVar7 * (uint)local_148) * (ulong)(h * w);
    local_158 = pLVar12;
    local_130 = &state->info_raw;
    out_00 = (uchar *)malloc(lVar11 + 7U >> 3);
    if (lVar11 == 0 || out_00 != (uchar *)0x0) {
      uVar6 = lodepng_convert(out_00,image,(LodePNGColorMode *)(local_118 + 0x10),local_130,w,h);
      pLVar12 = local_158;
      state->error = uVar6;
      if (uVar6 == 0) {
        preProcessScanlines(&local_140,&local_138,out_00,w,h,(LodePNGInfo *)local_118,local_158);
      }
    }
    else {
      state->error = 0x53;
      pLVar12 = local_158;
    }
    free(out_00);
  }
  else {
    preProcessScanlines(&local_140,&local_138,image,w,h,(LodePNGInfo *)local_118,pLVar12);
  }
  local_178.allocsize = 0;
  uVar6 = (uint)local_148;
  local_178.data = (uchar *)0x0;
  local_178.size = 0;
  if (state->error != 0) goto LAB_00383d48;
  local_158 = pLVar12;
  writeSignature(&local_178);
  pLVar12 = local_158;
  addChunk_IHDR(&local_178,w,h,(LodePNGColorType)local_150,uVar6,local_118._8_4_);
  if (local_60 != (uchar *)0x0) {
    uVar6 = addUnknownChunks(&local_178,local_60,(size_t)puStack_48);
    state->error = uVar6;
    if (uVar6 != 0) goto LAB_00383d48;
  }
  if ((uint)local_150 == 3) {
    addChunk_PLTE(&local_178,(LodePNGColorMode *)(local_118 + 0x10));
    uVar6 = getPaletteTranslucency((uchar *)local_118._24_8_,sStack_f8);
joined_r0x00383e5d:
    if (uVar6 != 0) {
      addChunk_tRNS(&local_178,(LodePNGColorMode *)(local_118 + 0x10));
    }
  }
  else {
    if ((((uint)local_150 & 0xfffffffb) == 2) && ((state->encoder).force_palette != 0)) {
      addChunk_PLTE(&local_178,(LodePNGColorMode *)(local_118 + 0x10));
    }
    if (((ulong)local_150 & 0xfffffffd) == 0) {
      uVar6 = uStack_f0;
      goto joined_r0x00383e5d;
    }
  }
  if (local_e0 != 0) {
    addChunk_bKGD(&local_178,(LodePNGInfo *)local_118);
  }
  if (local_74 != 0) {
    addChunk_pHYs(&local_178,(LodePNGInfo *)local_118);
  }
  if (puStack_58 != (uchar *)0x0) {
    uVar6 = addUnknownChunks(&local_178,puStack_58,local_40);
    state->error = uVar6;
    if (uVar6 != 0) goto LAB_00383d48;
  }
  uVar6 = addChunk_IDAT(&local_178,local_140,local_138,&pLVar12->zlibsettings);
  state->error = uVar6;
  if (uVar6 != 0) goto LAB_00383d48;
  if (local_90 != 0) {
    addChunk_tIME(&local_178,&local_8c);
  }
  ppcVar4 = ppcStack_c0;
  ppcVar3 = ppcStack_c8;
  lVar11 = CONCAT44(uStack_cc,uStack_d0);
  if (lVar11 == 0) {
    if ((state->encoder).add_id != 0) goto LAB_00383fce;
  }
  else {
    lVar9 = 0;
    do {
      pcVar1 = ppcVar3[lVar9];
      sVar8 = strlen(pcVar1);
      if (0x4f < sVar8) {
        uVar6 = 0x42;
LAB_00383f90:
        state->error = uVar6;
        break;
      }
      if (sVar8 == 0) {
        uVar6 = 0x43;
        goto LAB_00383f90;
      }
      if ((state->encoder).text_compression == 0) {
        addChunk_tEXt(&local_178,pcVar1,ppcVar4[lVar9]);
      }
      else {
        addChunk_zTXt(&local_178,pcVar1,ppcVar4[lVar9],&local_158->zlibsettings);
      }
      lVar9 = lVar9 + 1;
    } while (lVar11 != lVar9);
    ppcVar3 = ppcStack_c8;
    if ((state->encoder).add_id != 0) {
      if (lVar11 != 0) {
        lVar9 = 0;
        do {
          iVar7 = strcmp(ppcVar3[lVar9],"LodePNG");
          if (iVar7 == 0) goto LAB_00383fe6;
          lVar9 = lVar9 + 1;
        } while (lVar11 != lVar9);
      }
LAB_00383fce:
      addChunk_tEXt(&local_178,"LodePNG",LODEPNG_VERSION_STRING);
    }
  }
LAB_00383fe6:
  ppcVar4 = ppcStack_a8;
  ppcVar3 = ppcStack_b0;
  sVar5 = sStack_b8;
  if (sStack_b8 != 0) {
    sVar10 = 0;
    local_150 = local_a0;
    local_148 = local_98;
    do {
      pcVar1 = ppcVar3[sVar10];
      sVar8 = strlen(pcVar1);
      if (0x4f < sVar8) {
        uVar6 = 0x42;
LAB_00384084:
        state->error = uVar6;
        break;
      }
      if (sVar8 == 0) {
        uVar6 = 0x43;
        goto LAB_00384084;
      }
      addChunk_iTXt(&local_178,(state->encoder).text_compression,pcVar1,ppcVar4[sVar10],
                    local_150[sVar10],local_148[sVar10],&local_158->zlibsettings);
      sVar10 = sVar10 + 1;
    } while (sVar5 != sVar10);
  }
  if (puStack_50 != (uchar *)0x0) {
    uVar6 = addUnknownChunks(&local_178,puStack_50,local_38);
    state->error = uVar6;
    if (uVar6 != 0) goto LAB_00383d48;
  }
  lodepng_chunk_create(&local_178.data,&local_178.size,0,"IEND",(uchar *)0x0);
LAB_00383d48:
  lodepng_info_cleanup((LodePNGInfo *)local_118);
  free(local_140);
  *local_128 = local_178.data;
  *local_120 = local_178.size;
  return state->error;
}

Assistant:

unsigned lodepng_encode(unsigned char** out, size_t* outsize,
                        const unsigned char* image, unsigned w, unsigned h,
                        LodePNGState* state)
{
  LodePNGInfo info;
  ucvector outv;
  unsigned char* data = 0; /*uncompressed version of the IDAT chunk data*/
  size_t datasize = 0;

  /*provide some proper output values if error will happen*/
  *out = 0;
  *outsize = 0;
  state->error = 0;

  lodepng_info_init(&info);
  lodepng_info_copy(&info, &state->info_png);

  if((info.color.colortype == LCT_PALETTE || state->encoder.force_palette)
      && (info.color.palettesize == 0 || info.color.palettesize > 256))
  {
    state->error = 68; /*invalid palette size, it is only allowed to be 1-256*/
    return state->error;
  }

  if(state->encoder.auto_convert)
  {
    state->error = lodepng_auto_choose_color(&info.color, image, w, h, &state->info_raw);
  }
  if(state->error) return state->error;

  if(state->encoder.zlibsettings.btype > 2)
  {
    CERROR_RETURN_ERROR(state->error, 61); /*error: unexisting btype*/
  }
  if(state->info_png.interlace_method > 1)
  {
    CERROR_RETURN_ERROR(state->error, 71); /*error: unexisting interlace mode*/
  }

  state->error = checkColorValidity(info.color.colortype, info.color.bitdepth);
  if(state->error) return state->error; /*error: unexisting color type given*/
  state->error = checkColorValidity(state->info_raw.colortype, state->info_raw.bitdepth);
  if(state->error) return state->error; /*error: unexisting color type given*/

  if(!lodepng_color_mode_equal(&state->info_raw, &info.color))
  {
    unsigned char* converted;
    size_t size = (w * h * (size_t)lodepng_get_bpp(&info.color) + 7) / 8;

    converted = (unsigned char*)lodepng_malloc(size);
    if(!converted && size) state->error = 83; /*alloc fail*/
    if(!state->error)
    {
      state->error = lodepng_convert(converted, image, &info.color, &state->info_raw, w, h);
    }
    if(!state->error) preProcessScanlines(&data, &datasize, converted, w, h, &info, &state->encoder);
    lodepng_free(converted);
  }
  else preProcessScanlines(&data, &datasize, image, w, h, &info, &state->encoder);

  ucvector_init(&outv);
  while(!state->error) /*while only executed once, to break on error*/
  {
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    size_t i;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*write signature and chunks*/
    writeSignature(&outv);
    /*IHDR*/
    addChunk_IHDR(&outv, w, h, info.color.colortype, info.color.bitdepth, info.interlace_method);
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*unknown chunks between IHDR and PLTE*/
    if(info.unknown_chunks_data[0])
    {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[0], info.unknown_chunks_size[0]);
      if(state->error) break;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*PLTE*/
    if(info.color.colortype == LCT_PALETTE)
    {
      addChunk_PLTE(&outv, &info.color);
    }
    if(state->encoder.force_palette && (info.color.colortype == LCT_RGB || info.color.colortype == LCT_RGBA))
    {
      addChunk_PLTE(&outv, &info.color);
    }
    /*tRNS*/
    if(info.color.colortype == LCT_PALETTE && getPaletteTranslucency(info.color.palette, info.color.palettesize) != 0)
    {
      addChunk_tRNS(&outv, &info.color);
    }
    if((info.color.colortype == LCT_GREY || info.color.colortype == LCT_RGB) && info.color.key_defined)
    {
      addChunk_tRNS(&outv, &info.color);
    }
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*bKGD (must come between PLTE and the IDAt chunks*/
    if(info.background_defined) addChunk_bKGD(&outv, &info);
    /*pHYs (must come before the IDAT chunks)*/
    if(info.phys_defined) addChunk_pHYs(&outv, &info);

    /*unknown chunks between PLTE and IDAT*/
    if(info.unknown_chunks_data[1])
    {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[1], info.unknown_chunks_size[1]);
      if(state->error) break;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*IDAT (multiple IDAT chunks must be consecutive)*/
    state->error = addChunk_IDAT(&outv, data, datasize, &state->encoder.zlibsettings);
    if(state->error) break;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*tIME*/
    if(info.time_defined) addChunk_tIME(&outv, &info.time);
    /*tEXt and/or zTXt*/
    for(i = 0; i != info.text_num; ++i)
    {
      if(strlen(info.text_keys[i]) > 79)
      {
        state->error = 66; /*text chunk too large*/
        break;
      }
      if(strlen(info.text_keys[i]) < 1)
      {
        state->error = 67; /*text chunk too small*/
        break;
      }
      if(state->encoder.text_compression)
      {
        addChunk_zTXt(&outv, info.text_keys[i], info.text_strings[i], &state->encoder.zlibsettings);
      }
      else
      {
        addChunk_tEXt(&outv, info.text_keys[i], info.text_strings[i]);
      }
    }
    /*LodePNG version id in text chunk*/
    if(state->encoder.add_id)
    {
      unsigned alread_added_id_text = 0;
      for(i = 0; i != info.text_num; ++i)
      {
        if(!strcmp(info.text_keys[i], "LodePNG"))
        {
          alread_added_id_text = 1;
          break;
        }
      }
      if(alread_added_id_text == 0)
      {
        addChunk_tEXt(&outv, "LodePNG", LODEPNG_VERSION_STRING); /*it's shorter as tEXt than as zTXt chunk*/
      }
    }
    /*iTXt*/
    for(i = 0; i != info.itext_num; ++i)
    {
      if(strlen(info.itext_keys[i]) > 79)
      {
        state->error = 66; /*text chunk too large*/
        break;
      }
      if(strlen(info.itext_keys[i]) < 1)
      {
        state->error = 67; /*text chunk too small*/
        break;
      }
      addChunk_iTXt(&outv, state->encoder.text_compression,
                    info.itext_keys[i], info.itext_langtags[i], info.itext_transkeys[i], info.itext_strings[i],
                    &state->encoder.zlibsettings);
    }

    /*unknown chunks between IDAT and IEND*/
    if(info.unknown_chunks_data[2])
    {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[2], info.unknown_chunks_size[2]);
      if(state->error) break;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    addChunk_IEND(&outv);

    break; /*this isn't really a while loop; no error happened so break out now!*/
  }

  lodepng_info_cleanup(&info);
  lodepng_free(data);
  /*instead of cleaning the vector up, give it to the output*/
  *out = outv.data;
  *outsize = outv.size;

  return state->error;
}